

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O0

int __thiscall ncnn::Proposal::load_param(Proposal *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  Mat *in_RDI;
  float fVar2;
  Mat *in_stack_00000008;
  Mat *in_stack_00000010;
  int in_stack_0000001c;
  Mat *this_00;
  Mat local_50;
  ParamDict *local_10;
  
  local_10 = in_RSI;
  iVar1 = ParamDict::get(in_RSI,0,0x10);
  *(int *)&in_RDI[2].cstep = iVar1;
  iVar1 = ParamDict::get(local_10,1,0x10);
  *(int *)((long)&in_RDI[2].cstep + 4) = iVar1;
  iVar1 = ParamDict::get(local_10,2,6000);
  *(int *)&in_RDI[3].data = iVar1;
  iVar1 = ParamDict::get(local_10,3,300);
  *(int *)((long)&in_RDI[3].data + 4) = iVar1;
  fVar2 = ParamDict::get(local_10,4,0.7);
  *(float *)&in_RDI[3].refcount = fVar2;
  iVar1 = ParamDict::get(local_10,5,0x10);
  *(int *)((long)&in_RDI[3].refcount + 4) = iVar1;
  this_00 = &local_50;
  generate_anchors(in_stack_0000001c,in_stack_00000010,in_stack_00000008);
  Mat::operator=(this_00,in_RDI);
  Mat::~Mat((Mat *)0x154ea6);
  return 0;
}

Assistant:

int Proposal::load_param(const ParamDict& pd)
{
    feat_stride = pd.get(0, 16);
    base_size = pd.get(1, 16);
    pre_nms_topN = pd.get(2, 6000);
    after_nms_topN = pd.get(3, 300);
    nms_thresh = pd.get(4, 0.7f);
    min_size = pd.get(5, 16);

//     Mat ratio;
//     Mat scale;

    anchors = generate_anchors(base_size, ratios, scales);

    return 0;
}